

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::convertUIToF32(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  float local_3c;
  BasicType local_20 [2];
  Literal *local_18;
  Literal *this_local;
  
  local_20[1] = 2;
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = wasm::Type::operator==(&this->type,local_20 + 1);
  if (bVar1) {
    Literal(__return_storage_ptr__,(float)(uint)(this->field_0).i32);
  }
  else {
    local_20[0] = i64;
    bVar1 = wasm::Type::operator==(&this->type,local_20);
    if (!bVar1) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x2e1);
    }
    local_3c = (float)(this->field_0).func.super_IString.str._M_len;
    Literal(__return_storage_ptr__,local_3c);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::convertUIToF32() const {
  if (type == Type::i32) {
    return Literal(float(uint32_t(i32)));
  }
  if (type == Type::i64) {
    return Literal(float(uint64_t(i64)));
  }
  WASM_UNREACHABLE("invalid type");
}